

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::recombine(TranslateToFuzzReader *this,Function *func)

{
  bool bVar1;
  Index IVar2;
  int iVar3;
  size_type sVar4;
  value_type *ppEVar5;
  reference ppVar6;
  undefined4 extraout_var;
  undefined1 local_2d8 [8];
  Modder modder;
  Expression **item;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range2;
  pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  *pair_1;
  iterator __end1_1;
  iterator __begin1_1;
  InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  *__range1_1;
  size_t i;
  size_t num;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> trimmed;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *list;
  pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  *pair;
  iterator __end1;
  iterator __begin1;
  InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  *__range1;
  undefined1 local_148 [8];
  Scanner scanner;
  Function *func_local;
  TranslateToFuzzReader *this_local;
  
  scanner.exprsByType.List.
  super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
  ._M_impl._M_node._M_size = (size_t)func;
  bVar1 = oneIn(this,2);
  if (!bVar1) {
    recombine(wasm::Function*)::Scanner::Scanner(wasm::TranslateToFuzzReader__
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)local_148,this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::walk
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)local_148,
               (Expression **)
               (scanner.exprsByType.List.
                super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                ._M_impl._M_node._M_size + 0x60));
    __end1 = InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             ::begin((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                      *)&scanner.parent);
    pair = (pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            *)InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              ::end((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                     *)&scanner.parent);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&pair), bVar1) {
      ppVar6 = std::
               _List_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>
               ::operator*(&__end1);
      bVar1 = oneIn(this,2);
      if (!bVar1) {
        trimmed.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&ppVar6->second;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num);
        sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           trimmed.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        IVar2 = upToSquared(this,(Index)sVar4);
        for (__range1_1 = (InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                           *)0x0;
            __range1_1 <
            (InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             *)(ulong)IVar2;
            __range1_1 = (InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                          *)((long)&(__range1_1->Map)._M_h._M_buckets + 1)) {
          ppEVar5 = pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                              (this,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)trimmed.
                                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num,ppEVar5
                    );
        }
        bVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num);
        if (bVar1) {
          ppEVar5 = pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                              (this,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)trimmed.
                                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num,ppEVar5
                    );
        }
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::swap
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   trimmed.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num);
      }
      std::
      _List_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>
      ::operator++(&__end1);
    }
    __end1_1 = InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
               ::begin((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                        *)&scanner.parent);
    pair_1 = (pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              *)InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                ::end((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                       *)&scanner.parent);
    while (bVar1 = std::operator!=(&__end1_1,(_Self *)&pair_1), bVar1) {
      ppVar6 = std::
               _List_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>
               ::operator*(&__end1_1);
      __end2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                         (&ppVar6->second);
      item = (Expression **)
             std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                       (&ppVar6->second);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                         *)&item), bVar1) {
        modder.parent =
             (TranslateToFuzzReader *)
             __gnu_cxx::
             __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             ::operator*(&__end2);
        iVar3 = ExpressionManipulator::copy
                          ((EVP_PKEY_CTX *)(modder.parent)->wasm,(EVP_PKEY_CTX *)this->wasm);
        (modder.parent)->wasm = (Module *)CONCAT44(extraout_var,iVar3);
        __gnu_cxx::
        __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        ::operator++(&__end2);
      }
      std::
      _List_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>
      ::operator++(&__end1_1);
    }
    recombine(wasm::Function*)::Modder::Modder(wasm::Module&,wasm::TranslateToFuzzReader::
    recombine(wasm::Function*)::Scanner&,wasm::TranslateToFuzzReader__
              (local_2d8,this->wasm,(Scanner *)local_148,this);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::walk
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)local_2d8,
               (Expression **)
               (scanner.exprsByType.List.
                super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                ._M_impl._M_node._M_size + 0x60));
    recombine::Modder::~Modder((Modder *)local_2d8);
    recombine::Scanner::~Scanner((Scanner *)local_148);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::recombine(Function* func) {
  // Don't always do this.
  if (oneIn(2)) {
    return;
  }
  // First, scan and group all expressions by type.
  struct Scanner
    : public PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>> {
    TranslateToFuzzReader& parent;
    // A map of all expressions, categorized by type.
    InsertOrderedMap<Type, std::vector<Expression*>> exprsByType;
    Scanner(TranslateToFuzzReader& parent) : parent(parent) {}

    void visitExpression(Expression* curr) {
      if (parent.canBeArbitrarilyReplaced(curr)) {
        for (auto type : getRelevantTypes(curr->type)) {
          exprsByType[type].push_back(curr);
        }
      }
    }

    std::vector<Type> getRelevantTypes(Type type) {
      // Given an expression of a type, we can replace not only other
      // expressions with the same type, but also supertypes - since then we'd
      // be replacing with a subtype, which is valid.
      if (!type.isRef()) {
        return {type};
      }

      std::vector<Type> ret;
      ret.push_back(type);

      if (type.isNonNullable()) {
        auto nullable = getRelevantTypes(type.with(Nullable));
        ret.insert(ret.end(), nullable.begin(), nullable.end());
      }
      if (type.isExact()) {
        auto inexact = getRelevantTypes(type.with(Inexact));
        ret.insert(ret.end(), inexact.begin(), inexact.end());
        // Do not consider exact references to supertypes.
        return ret;
      }

      for (auto heapType = type.getHeapType().getSuperType(); heapType;
           heapType = heapType->getSuperType()) {
        ret.push_back(type.with(*heapType));
      }

      return ret;
    }
  };
  Scanner scanner(*this);
  scanner.walk(func->body);
  // Potentially trim the list of possible picks, so replacements are more
  // likely to collide.
  for (auto& pair : scanner.exprsByType) {
    if (oneIn(2)) {
      continue;
    }
    auto& list = pair.second;
    std::vector<Expression*> trimmed;
    size_t num = upToSquared(list.size());
    for (size_t i = 0; i < num; i++) {
      trimmed.push_back(pick(list));
    }
    if (trimmed.empty()) {
      trimmed.push_back(pick(list));
    }
    list.swap(trimmed);
  }
  // Replace them with copies, to avoid a copy into one altering another copy
  for (auto& pair : scanner.exprsByType) {
    for (auto*& item : pair.second) {
      item = ExpressionManipulator::copy(item, wasm);
    }
  }
  // Second, with some probability replace an item with another item having
  // a proper type. (This is not always valid due to nesting of labels, but
  // we'll fix that up later.)
  struct Modder : public PostWalker<Modder, UnifiedExpressionVisitor<Modder>> {
    Module& wasm;
    Scanner& scanner;
    TranslateToFuzzReader& parent;

    Modder(Module& wasm, Scanner& scanner, TranslateToFuzzReader& parent)
      : wasm(wasm), scanner(scanner), parent(parent) {}

    void visitExpression(Expression* curr) {
      if (parent.oneIn(10) && parent.canBeArbitrarilyReplaced(curr)) {
        // Replace it!
        auto& candidates = scanner.exprsByType[curr->type];
        assert(!candidates.empty()); // this expression itself must be there
        auto* rep = parent.pick(candidates);
        replaceCurrent(ExpressionManipulator::copy(rep, wasm));
      }
    }
  };
  Modder modder(wasm, scanner, *this);
  modder.walk(func->body);
  // TODO: A specific form of recombination we should perhaps do more often is
  //       to recombine among an expression's children, and in particular to
  //       reorder them.
}